

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O3

void VP8SetIntra4Mode(VP8EncIterator *it,uint8_t *modes)

{
  uint8_t *puVar1;
  uint uVar2;
  
  puVar1 = it->preds;
  uVar2 = 5;
  do {
    *(undefined4 *)puVar1 = *(undefined4 *)modes;
    puVar1 = puVar1 + it->enc->preds_w;
    modes = modes + 4;
    uVar2 = uVar2 - 1;
  } while (1 < uVar2);
  *(byte *)it->mb = *(byte *)it->mb & 0xfc;
  return;
}

Assistant:

void VP8SetIntra4Mode(const VP8EncIterator* const it, const uint8_t* modes) {
  uint8_t* preds = it->preds;
  int y;
  for (y = 4; y > 0; --y) {
    memcpy(preds, modes, 4 * sizeof(*modes));
    preds += it->enc->preds_w;
    modes += 4;
  }
  it->mb->type = 0;
}